

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<6,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar1;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar2;
  Type in0;
  MatrixCaseUtils local_bc [12];
  Mat4 local_b0;
  VecAccess<float,_4,_3> local_70;
  Matrix<float,_4,_4> local_58;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,13>
              (&local_b0,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    uVar1 = extraout_EDX;
    uVar2 = extraout_var;
  }
  else {
    tcu::Matrix<float,_4,_4>::Matrix(&local_b0,(float *)sr::(anonymous_namespace)::s_constInMat4x4);
    uVar1 = extraout_EDX_00;
    uVar2 = extraout_var_00;
  }
  tcu::transpose<float,4,4>(&local_58,(tcu *)&local_b0,(Matrix<float,_4,_4> *)CONCAT44(uVar2,uVar1))
  ;
  reduceToVec3(local_bc,&local_58);
  local_70.m_vector = &evalCtx->color;
  local_70.m_index[0] = 0;
  local_70.m_index[1] = 1;
  local_70.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_70,(Vector<float,_3> *)local_bc);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}